

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

value * eval::func_eval(func *func,vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args,
                       context *c)

{
  pointer pptVar1;
  value_type pvVar2;
  undefined8 uVar3;
  context *this;
  bool bVar4;
  type tVar5;
  size_type sVar6;
  reference pptVar7;
  reference ppVar8;
  ulong uVar9;
  reference ppvVar10;
  reference pptVar11;
  mapped_type *ppvVar12;
  value *val;
  int local_fc;
  expression *peStack_f8;
  int i_2;
  expression *e;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
  i_1;
  iterator __end1;
  iterator __begin1;
  context *__range1;
  context c2;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  vector<eval::value_*,_std::allocator<eval::value_*>_> e_args;
  vector<parser::thing_*,_std::allocator<parser::thing_*>_> local_40;
  context *local_28;
  context *c_local;
  vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args_local;
  func *func_local;
  
  local_28 = c;
  c_local = (context *)args;
  args_local = (vector<parser::thing_*,_std::allocator<parser::thing_*>_> *)func;
  bVar4 = eval::func::is_std(func);
  if (bVar4) {
    pptVar1 = args_local[1].super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::vector(&local_40,args);
    func_local = (func *)(*(code *)pptVar1)(&local_40,local_28);
    std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::~vector(&local_40);
  }
  else {
    std::vector<eval::value_*,_std::allocator<eval::value_*>_>::vector
              ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_68);
    local_6c = 1;
    while( true ) {
      sVar6 = std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::size(args);
      if (sVar6 <= (ulong)(long)local_6c) break;
      pptVar7 = std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::operator[]
                          (args,(long)local_6c);
      c2._M_h._M_single_bucket = (__node_base_ptr)eval(*pptVar7,local_28);
      std::vector<eval::value_*,_std::allocator<eval::value_*>_>::push_back
                ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_68,
                 (value_type *)&c2._M_h._M_single_bucket);
      local_6c = local_6c + 1;
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                     *)&__range1);
    stdlib::init_stdlib((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                         *)&__range1);
    this = local_28;
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
             ::begin(local_28);
    i_1.second = (value *)std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                          ::end(this);
    while( true ) {
      bVar4 = std::__detail::operator!=
                        (&__end1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_true>
                           *)&i_1.second);
      if (!bVar4) break;
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_false,_true>
               ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
              *)&e,ppVar8);
      tVar5 = value::get_type((value *)i_1.first.field_2._8_8_);
      uVar3 = i_1.first.field_2._8_8_;
      if (tVar5 == FUNC) {
        ppvVar12 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                                 *)&__range1,(key_type *)&e);
        *ppvVar12 = (mapped_type)uVar3;
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>
               *)&e);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_false,_true>
      ::operator++(&__end1);
    }
    peStack_f8 = eval::func::get_body((func *)args_local);
    local_fc = 0;
    while( true ) {
      uVar9 = (ulong)local_fc;
      sVar6 = std::vector<parser::token_*,_std::allocator<parser::token_*>_>::size
                        ((vector<parser::token_*,_std::allocator<parser::token_*>_> *)
                         args_local[1].
                         super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar6 <= uVar9) break;
      ppvVar10 = std::vector<eval::value_*,_std::allocator<eval::value_*>_>::operator[]
                           ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_68,
                            (long)local_fc);
      pvVar2 = *ppvVar10;
      pptVar11 = std::vector<parser::token_*,_std::allocator<parser::token_*>_>::operator[]
                           ((vector<parser::token_*,_std::allocator<parser::token_*>_> *)
                            args_local[1].
                            super__Vector_base<parser::thing_*,_std::allocator<parser::thing_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_fc);
      parser::token::get_content_abi_cxx11_((string *)&val,*pptVar11);
      ppvVar12 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                               *)&__range1,(key_type *)&val);
      *ppvVar12 = pvVar2;
      std::__cxx11::string::~string((string *)&val);
      local_fc = local_fc + 1;
    }
    func_local = (func *)eval(&peStack_f8->super_thing,(context *)&__range1);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>_>
                      *)&__range1);
    std::vector<eval::value_*,_std::allocator<eval::value_*>_>::~vector
              ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_68);
  }
  return &func_local->super_value;
}

Assistant:

eval::value *eval::func_eval(eval::func *func, std::vector<parser::thing *> args, context &c) {

  if (func->is_std())
    return func->f(args, c);

  std::vector<eval::value *> e_args;
  for (int i = 1; i < args.size(); i++) {
    e_args.push_back(eval::eval(args[i], c));
  }

  context c2;
  stdlib::init_stdlib(c2);

  for (auto i : c) {
    if ((i.second)->get_type()==eval::type::FUNC)
      c2[i.first] = i.second;
  }

  parser::expression *e = func->get_body();
  for (int i = 0; i < func->arg_list->size(); i++) {

    c2[((*(func->arg_list))[i])->get_content()] = e_args[i];

  }

  eval::value *val = eval::eval(e, c2);

  return val;

}